

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O3

bool google::protobuf::internal::WireFormatLite::ReadPackedEnumNoInline
               (CodedInputStream *input,_func_bool_int *is_valid,RepeatedField<int> *values)

{
  byte bVar1;
  byte *pbVar2;
  bool bVar3;
  Limit limit;
  int iVar4;
  int64 iVar5;
  ulong uVar6;
  uint first_byte_or_zero;
  uint32 first_byte_or_zero_00;
  
  pbVar2 = input->buffer_;
  if (pbVar2 < input->buffer_end_) {
    first_byte_or_zero = (uint)*pbVar2;
    if (-1 < (char)*pbVar2) {
      input->buffer_ = pbVar2 + 1;
      goto LAB_002c6d2e;
    }
  }
  else {
    first_byte_or_zero = 0;
  }
  iVar5 = io::CodedInputStream::ReadVarint32Fallback(input,first_byte_or_zero);
  first_byte_or_zero = (uint)iVar5;
  if (iVar5 < 0) {
    return false;
  }
LAB_002c6d2e:
  limit = io::CodedInputStream::PushLimit(input,first_byte_or_zero);
  do {
    iVar4 = io::CodedInputStream::BytesUntilLimit(input);
    if (iVar4 < 1) {
      io::CodedInputStream::PopLimit(input,limit);
      return true;
    }
    pbVar2 = input->buffer_;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar6 = (ulong)bVar1;
      first_byte_or_zero_00 = (uint32)bVar1;
      if ((char)bVar1 < '\0') goto LAB_002c6d61;
      input->buffer_ = pbVar2 + 1;
    }
    else {
      first_byte_or_zero_00 = 0;
LAB_002c6d61:
      uVar6 = io::CodedInputStream::ReadVarint32Fallback(input,first_byte_or_zero_00);
      if ((long)uVar6 < 0) {
        return false;
      }
    }
    if ((is_valid == (_func_bool_int *)0x0) || (bVar3 = (*is_valid)((int)uVar6), bVar3)) {
      iVar4 = values->current_size_;
      if (iVar4 == values->total_size_) {
        RepeatedField<int>::Reserve(values,iVar4 + 1);
        iVar4 = values->current_size_;
      }
      values->current_size_ = iVar4 + 1;
      values->rep_->elements[iVar4] = (int)uVar6;
    }
  } while( true );
}

Assistant:

bool WireFormatLite::ReadPackedEnumNoInline(io::CodedInputStream* input,
                                            bool (*is_valid)(int),
                                            RepeatedField<int>* values) {
  uint32 length;
  if (!input->ReadVarint32(&length)) return false;
  io::CodedInputStream::Limit limit = input->PushLimit(length);
  while (input->BytesUntilLimit() > 0) {
    int value;
    if (!google::protobuf::internal::WireFormatLite::ReadPrimitive<
        int, WireFormatLite::TYPE_ENUM>(input, &value)) {
      return false;
    }
    if (is_valid == NULL || is_valid(value)) {
      values->Add(value);
    }
  }
  input->PopLimit(limit);
  return true;
}